

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint * __thiscall ON_Mesh::GetVertexLocationIds(ON_Mesh *this,uint first_vid,uint *Vid,uint *Vindex)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  ON_3fPoint *fPoints;
  ON_3dPoint *dPoints;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  bVar2 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  if (bVar2) {
    dPoints = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
    fPoints = (ON_3fPoint *)0x0;
  }
  else {
    fPoints = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    dPoints = (ON_3dPoint *)0x0;
  }
  puVar3 = ON_GetPointLocationIdsHelper
                     (3,(ulong)uVar1,3,&fPoints->x,&dPoints->x,first_vid,Vid,Vindex);
  return puVar3;
}

Assistant:

unsigned int* ON_Mesh::GetVertexLocationIds(
  unsigned int first_vid,
  unsigned int* Vid,
  unsigned int* Vindex
  ) const
{
  const unsigned int vertex_count = VertexUnsignedCount();
  return (HasSynchronizedDoubleAndSinglePrecisionVertices())
    ? ON_GetPointLocationIds(vertex_count, m_dV.Array(), first_vid, Vid, Vindex)
    : ON_GetPointLocationIds(vertex_count, m_V.Array(), first_vid, Vid, Vindex);
}